

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi__uint16 * stbi_load_from_file_16(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  stbi__uint16 sVar1;
  stbi__uint16 *psVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  stbi__uint16 *psVar12;
  uint uVar13;
  stbi__uint16 *psVar14;
  stbi__uint16 *local_130;
  stbi__result_info ri;
  stbi__context s;
  
  stbi__start_file(&s,f);
  psVar2 = (stbi__uint16 *)stbi__load_main(&s,x,y,comp,req_comp,&ri,0x10);
  if (psVar2 != (stbi__uint16 *)0x0) {
    if (ri.bits_per_channel == 8) {
      iVar3 = req_comp;
      if (req_comp == 0) {
        iVar3 = *comp;
      }
      uVar13 = *y * *x * iVar3;
      local_130 = (stbi__uint16 *)malloc((long)(int)(uVar13 * 2));
      if (local_130 == (stbi__uint16 *)0x0) {
        stbi__g_failure_reason = "outofmem";
        local_130 = (stbi__uint16 *)0x0;
      }
      else {
        uVar7 = 0;
        uVar6 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar6 = uVar7;
        }
        for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          local_130[uVar7] = (ushort)*(byte *)((long)psVar2 + uVar7) * 0x101;
        }
        free(psVar2);
      }
    }
    else {
      local_130 = psVar2;
      if (ri.bits_per_channel != 0x10) {
        __assert_fail("ri.bits_per_channel == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_image.h"
                      ,0x436,
                      "stbi__uint16 *stbi__load_and_postprocess_16bit(stbi__context *, int *, int *, int *, int)"
                     );
      }
    }
    if (stbi__vertically_flip_on_load != 0) {
      uVar13 = *x;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar4 = *y >> 1;
      uVar6 = 0;
      uVar7 = 0;
      if (0 < req_comp) {
        uVar7 = (ulong)(uint)req_comp;
      }
      lVar8 = (long)req_comp;
      uVar9 = 0;
      if (0 < (int)uVar13) {
        uVar9 = (ulong)uVar13;
      }
      uVar5 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar5 = uVar6;
      }
      iVar3 = (*y + -1) * uVar13;
      psVar2 = local_130;
      for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
        psVar12 = (stbi__uint16 *)((long)iVar3 * lVar8 * 2 + (long)local_130);
        psVar14 = psVar2;
        for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
          for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
            sVar1 = psVar14[uVar11];
            psVar14[uVar11] = psVar12[uVar11];
            psVar12[uVar11] = sVar1;
          }
          psVar12 = psVar12 + lVar8;
          psVar14 = psVar14 + lVar8;
        }
        iVar3 = iVar3 - uVar13;
        psVar2 = psVar2 + lVar8 * (int)uVar13;
      }
    }
    if (local_130 != (stbi__uint16 *)0x0) {
      fseek((FILE *)f,(long)((int)s.img_buffer - (int)s.img_buffer_end),1);
      return local_130;
    }
  }
  return (stbi__uint16 *)0x0;
}

Assistant:

STBIDEF stbi__uint16 *stbi_load_from_file_16(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   stbi__uint16 *result;
   stbi__context s;
   stbi__start_file(&s,f);
   result = stbi__load_and_postprocess_16bit(&s,x,y,comp,req_comp);
   if (result) {
      // need to 'unget' all the characters in the IO buffer
      fseek(f, - (int) (s.img_buffer_end - s.img_buffer), SEEK_CUR);
   }
   return result;
}